

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * formatCodePoint_abi_cxx11_(string *__return_storage_ptr__,ThreadId threadId)

{
  undefined1 local_b8 [8];
  FrameState vf;
  ThreadState vt;
  
  (*(debugger.super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_IDebugger[0xc])
            (&vf.scopeIds.
              super__Vector_base<chatra::debugger::ScopeId,_std::allocator<chatra::debugger::ScopeId>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             debugger.super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,threadId);
  if ((pointer)vt.threadId ==
      vt.frameIds.
      super__Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"@unknown",(allocator *)local_b8);
  }
  else {
    (*(debugger.super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_IDebugger[0xd])
              (local_b8,debugger.
                        super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,threadId,*(undefined8 *)vt.threadId);
    formatCodePoint_abi_cxx11_(__return_storage_ptr__,(CodePoint *)&vf.frameType);
    chatra::debugger::FrameState::~FrameState((FrameState *)local_b8);
  }
  std::_Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>::
  ~_Vector_base((_Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>
                 *)&vt);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatCodePoint(cha::d::ThreadId threadId) {
	auto vt = debugger->getThreadState(threadId);
	if (vt.frameIds.empty())
		return "@unknown";

	auto vf = debugger->getFrameState(threadId, vt.frameIds.front());
	return formatCodePoint(vf.current);
}